

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O2

void __thiscall
GlobOpt::KillLiveFields(GlobOpt *this,StackSym *stackSym,BVSparse<Memory::JitArenaAllocator> *bv)

{
  PropertySym *pPVar1;
  Loop *pLVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  ObjectSymInfo *pOVar6;
  PropertySym **ppPVar7;
  Loop **ppLVar8;
  
  if (((stackSym->field_0x1a & 1) != 0) &&
     (stackSym = StackSym::GetVarEquivSym(stackSym,this->func), stackSym == (StackSym *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x97,"(stackSym)","stackSym");
    if (!bVar4) {
LAB_0046a155:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
    stackSym = (StackSym *)0x0;
  }
  bVar4 = StackSym::HasObjectInfo(stackSym);
  if ((!bVar4) ||
     (((stackSym->field_0x18 & 1) != 0 && ((stackSym->field_5).m_instrDef != (Instr *)0x0)))) {
    return;
  }
  pOVar6 = StackSym::GetObjectInfo(stackSym);
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  ppPVar7 = &pOVar6->m_propertySymList;
  while (pPVar1 = *ppPVar7, pPVar1 != (PropertySym *)0x0) {
    if (pPVar1->m_stackSym != stackSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                         ,0xa6,"(propertySym->m_stackSym == stackSym)",
                         "propertySym->m_stackSym == stackSym");
      if (!bVar4) goto LAB_0046a155;
      *puVar5 = 0;
    }
    BVSparse<Memory::JitArenaAllocator>::Clear(bv,(pPVar1->super_Sym).m_id);
    ppLVar8 = &this->rootLoopPrePass;
    if (this->prePassLoop == (Loop *)0x0) {
      bVar4 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(bv);
      if (bVar4) break;
    }
    else {
      while (pLVar2 = *ppLVar8, pLVar2 != (Loop *)0x0) {
        BVSparse<Memory::JitArenaAllocator>::Set(pLVar2->fieldKilled,(pPVar1->super_Sym).m_id);
        ppLVar8 = &pLVar2->parent;
      }
    }
    ppPVar7 = &pPVar1->m_nextInStackSymList;
  }
  KillObjectType(this,stackSym,bv);
  return;
}

Assistant:

void
GlobOpt::KillLiveFields(StackSym * stackSym, BVSparse<JitArenaAllocator> * bv)
{
    if (stackSym->IsTypeSpec())
    {
        stackSym = stackSym->GetVarEquivSym(this->func);
    }
    Assert(stackSym);

    // If the sym has no objectSymInfo, it must not represent an object and, hence, has no type sym or
    // property syms to kill.
    if (!stackSym->HasObjectInfo() || stackSym->IsSingleDef())
    {
        return;
    }

    // Note that the m_writeGuardSym is killed here as well, because it is part of the
    // m_propertySymList of the object.
    ObjectSymInfo * objectSymInfo = stackSym->GetObjectInfo();
    PropertySym * propertySym = objectSymInfo->m_propertySymList;
    while (propertySym != nullptr)
    {
        Assert(propertySym->m_stackSym == stackSym);
        bv->Clear(propertySym->m_id);
        if (this->IsLoopPrePass())
        {
            for (Loop * loop = this->rootLoopPrePass; loop != nullptr; loop = loop->parent)
            {
                loop->fieldKilled->Set(propertySym->m_id);
            }
        }
        else if (bv->IsEmpty())
        {
            // shortcut
            break;
        }
        propertySym = propertySym->m_nextInStackSymList;
    }

    this->KillObjectType(stackSym, bv);
}